

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FileOptions * __thiscall
google::protobuf::DescriptorPool::Tables::AllocateMessage<google::protobuf::FileOptions>
          (Tables *this,FileOptions *param_1)

{
  FileOptions *this_00;
  FileOptions *local_38 [3];
  FileOptions *local_20;
  FileOptions *result;
  FileOptions *param_1_local;
  Tables *this_local;
  
  result = param_1;
  param_1_local = (FileOptions *)this;
  this_00 = (FileOptions *)operator_new(0xb0);
  FileOptions::FileOptions(this_00);
  local_38[0] = this_00;
  local_20 = this_00;
  std::vector<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>::push_back
            (&this->messages_,(value_type *)local_38);
  return local_20;
}

Assistant:

Type* DescriptorPool::Tables::AllocateMessage(Type* /* dummy */) {
  Type* result = new Type;
  messages_.push_back(result);
  return result;
}